

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

int absl::lts_20250127::strings_internal::Compare<84,84>(BigUnsigned<84> *lhs,BigUnsigned<84> *rhs)

{
  uint uVar1;
  uint uVar2;
  int in_EAX;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t uVar6;
  
  uVar1 = lhs->size_;
  uVar2 = rhs->size_;
  uVar3 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar5 = (ulong)uVar3;
  do {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) {
      return 0;
    }
    uVar6 = 0;
    uVar3 = 0;
    if (iVar4 <= (int)uVar1) {
      uVar3 = lhs->words_[uVar5 - 1];
    }
    if (iVar4 <= (int)uVar2) {
      uVar6 = rhs->words_[uVar5 - 1];
    }
    uVar5 = uVar5 - 1;
    if (uVar3 >= uVar6 && uVar3 != uVar6) {
      in_EAX = 1;
    }
    if (uVar3 < uVar6) {
      in_EAX = -1;
    }
  } while (uVar3 == uVar6);
  return in_EAX;
}

Assistant:

int size() const { return size_; }